

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void sel_move_grow_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,Am_Value *new_sel,
               Am_Value *new_value)

{
  int value;
  int value_00;
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value *in_value;
  undefined7 in_register_00000011;
  Am_Object parent;
  int top;
  int left;
  Am_Value new_data_value;
  Am_Object ref_obj;
  Am_Object inter;
  Am_Value local_f0;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  Am_Value local_d0;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Value *local_a8;
  Am_Value local_a0;
  Am_Value local_90;
  Am_Value local_80;
  Am_Value local_70;
  Am_Value local_60;
  Am_Value local_50;
  Am_Value local_40;
  
  local_dc = (undefined4)CONCAT71(in_register_00000011,selective);
  local_b0.data = (Am_Object_Data *)0x0;
  local_a8 = new_value;
  pAVar3 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_b0,pAVar3);
  if (reload_data) {
    bVar1 = Am_Value::Valid(new_sel);
    if (!bVar1) goto LAB_00255a69;
    Am_Object::Set(command_obj,0x16d,new_sel,0);
    local_f0._0_8_ = 0;
    pAVar3 = Am_Object::Get(command_obj,0x154,0);
    Am_Object::operator=((Am_Object *)&local_f0,pAVar3);
    bVar1 = Am_Object::Valid((Am_Object *)&local_f0);
    if (bVar1) {
      Am_Object::Set((Am_Object *)&local_f0,0x16d,new_sel,0);
    }
    Am_Object::~Am_Object((Am_Object *)&local_f0);
  }
  else {
LAB_00255a69:
    pAVar3 = Am_Object::Get(command_obj,0x16d,1);
    Am_Value::operator=(new_sel,pAVar3);
  }
  bVar1 = Am_Value::Valid(new_sel);
  if (!bVar1) goto LAB_00255d87;
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffffffff0000;
  local_f0.value.wrapper_value = (Am_Wrapper *)0x0;
  local_d0.type = 0;
  local_d0.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(command_obj,0x16c,1);
  Am_Value::operator=(&local_f0,pAVar3);
  if (!reload_data) {
    pAVar3 = Am_Object::Get(command_obj,0x169,1);
    Am_Value::operator=(&local_d0,pAVar3);
  }
  pAVar3 = Am_Object::Get(command_obj,0xda,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if ((char)local_dc != '\0') {
    if (undo) {
      pAVar3 = &local_40;
      Am_Value::Am_Value(pAVar3,new_sel);
      update_data_from_objs(pAVar3,&local_d0);
    }
    else {
      pAVar3 = &local_50;
      Am_Value::Am_Value(pAVar3,new_sel);
      update_data_from_objs(pAVar3,&local_f0);
    }
    Am_Value::~Am_Value(pAVar3);
  }
  pAVar3 = local_a8;
  if (undo) {
    Am_Value::Am_Value(&local_60,new_sel);
    pAVar3 = &local_f0;
    Am_Value::Am_Value(&local_70,pAVar3);
    update_objs_from_value(&local_60,&local_70,bVar1,command_obj);
    Am_Value::~Am_Value(&local_70);
    Am_Value::~Am_Value(&local_60);
    Am_Object::Set(command_obj,0x16c,&local_d0,0);
LAB_00255d61:
    Am_Object::Set(command_obj,0x169,pAVar3,0);
  }
  else {
    if (reload_data) {
      bVar2 = Am_Value::Valid(local_a8);
      if (bVar2) {
        Am_Value::operator=(&local_d0,pAVar3);
        in_value = Am_Object::Get(command_obj,0x171,0);
        Am_Object::Am_Object(&local_b8,in_value);
        Am_Object::Am_Object(&local_c0,&local_b8);
        get_left_and_top_from_new_value(pAVar3,&local_c0,&local_d4,&local_d8);
        Am_Object::~Am_Object(&local_c0);
        Am_Object::~Am_Object(&local_b8);
      }
      else {
        pAVar3 = Am_Object::Get(command_obj,100,0);
        local_d4 = Am_Value::operator_cast_to_int(pAVar3);
        pAVar3 = Am_Object::Get(command_obj,0x65,0);
        local_d8 = Am_Value::operator_cast_to_int(pAVar3);
      }
      Am_Value::Am_Value(&local_80,new_sel);
      value_00 = local_d4;
      value = local_d8;
      update_new_objs_from_pos(&local_80,local_d4,local_d8,&local_d0,bVar1,command_obj);
      Am_Value::~Am_Value(&local_80);
      Am_Object::Set(command_obj,100,value_00,0);
      Am_Object::Set(command_obj,0x65,value,0);
    }
    else {
      Am_Value::Am_Value(&local_90,new_sel);
      Am_Value::Am_Value(&local_a0,&local_d0);
      update_objs_from_value(&local_90,&local_a0,bVar1,command_obj);
      Am_Value::~Am_Value(&local_a0);
      Am_Value::~Am_Value(&local_90);
    }
    if ((char)local_dc != '\0') {
      Am_Object::Set(command_obj,0x16c,&local_f0,0);
    }
    if (reload_data) {
      pAVar3 = &local_d0;
      goto LAB_00255d61;
    }
  }
  Am_Value::~Am_Value(&local_d0);
  Am_Value::~Am_Value(&local_f0);
LAB_00255d87:
  Am_Object::~Am_Object(&local_b0);
  return;
}

Assistant:

void
sel_move_grow_general_undo_redo(Am_Object command_obj, bool undo,
                                bool selective, bool reload_data,
                                Am_Value new_sel = Am_No_Value,
                                Am_Value new_value = Am_No_Value)
{
  Am_Object inter;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);

  if (reload_data && new_sel.Valid()) {
    command_obj.Set(Am_OBJECT_MODIFIED, new_sel);
    Am_Object parent;
    parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
    if (parent.Valid())
      parent.Set(Am_OBJECT_MODIFIED, new_sel);
  } else
    new_sel = command_obj.Peek(Am_OBJECT_MODIFIED);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "repeat";
    std::cout << " command " << command_obj << " on " << new_sel << std::endl
              << std::flush;
  }
#endif
  if (new_sel.Valid()) {
    Am_Value old_data_value, new_data_value;

    old_data_value = command_obj.Peek(Am_OLD_VALUE);
    if (!reload_data)
      new_data_value = command_obj.Peek(Am_VALUE);
    bool growing = command_obj.Get(Am_GROWING);
    if (selective) {
      if (undo)
        update_data_from_objs(new_sel, new_data_value);
      else
        update_data_from_objs(new_sel, old_data_value);
    }
    if (undo) {
      update_objs_from_value(new_sel, old_data_value, growing, command_obj);
      // swap current and old values, in case undo or undo-the-undo again
      command_obj.Set(Am_OLD_VALUE, new_data_value);
      command_obj.Set(Am_VALUE, old_data_value);
    } else {
      if (reload_data) {
        int left, top;
        if (new_value.Valid()) {
          new_data_value = new_value;
          Am_Object ref_obj = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
          get_left_and_top_from_new_value(new_value, ref_obj, left, top);
        } else {
          left = command_obj.Get(Am_LEFT);
          top = command_obj.Get(Am_TOP);
        }
        update_new_objs_from_pos(new_sel, left, top, new_data_value, growing,
                                 command_obj);
        command_obj.Set(Am_LEFT, left);
        command_obj.Set(Am_TOP, top);
      } else
        update_objs_from_value(new_sel, new_data_value, growing, command_obj);
      if (selective)
        command_obj.Set(Am_OLD_VALUE, old_data_value);
      if (reload_data)
        command_obj.Set(Am_VALUE, new_data_value);
    }
  }
}